

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRAccessChain * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::
allocate<unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRAccessChain> *this,uint *p,StorageClass *p_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_3,uint *p_4)

{
  Vector<spirv_cross::SPIRAccessChain_*> *this_00;
  TypeID basetype_;
  StorageClass storage_;
  pointer pcVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
  _Var2;
  SPIRAccessChain *this_01;
  size_t sVar3;
  _Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> _Var4;
  ulong uVar5;
  string local_70;
  string local_50;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
  if (sVar3 == 0) {
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
            .buffer_size;
    uVar5 = (ulong)(this->start_object_count << ((byte)sVar3 & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>)malloc(uVar5 * 0xa8);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl ==
        (SPIRAccessChain *)0x0) {
      return (SPIRAccessChain *)0x0;
    }
    if (uVar5 != 0) {
      sVar3 = 0;
      _Var4._M_head_impl =
           (SPIRAccessChain *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::reserve(this_00,sVar3 + 1);
        sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar3] =
             _Var4._M_head_impl;
        sVar3 = sVar3 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size = sVar3;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      sVar3 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar3 + 1);
    sVar3 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
    .ptr[sVar3]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> =
         _Var2.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
    .buffer_size = sVar3 + 1;
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar3 - 1];
    if (sVar3 == 0) goto LAB_00274505;
  }
  else {
    this_01 = (this_00->super_VectorView<spirv_cross::SPIRAccessChain_*>).ptr[sVar3 - 1];
  }
  SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::resize(this_00,sVar3 - 1);
LAB_00274505:
  basetype_.id = *p;
  storage_ = *p_1;
  pcVar1 = (p_2->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + p_2->_M_string_length);
  pcVar1 = (p_3->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + p_3->_M_string_length);
  SPIRAccessChain::SPIRAccessChain(this_01,basetype_,storage_,&local_50,&local_70,*p_4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}